

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int python2Present(void)

{
  int iVar1;
  uint uVar2;
  
  if (python2Present::lPython2Present < 0) {
    python2Present::lPython2Present = 0;
    builtin_strncpy(gPython2Name,"python2",8);
    iVar1 = detectPresence(gPython2Name);
    if (iVar1 == 0) {
      uVar2 = 9;
      do {
        if ((int)uVar2 < 0) goto LAB_00157a6d;
        sprintf(gPython2Name,"python2.%d",(ulong)uVar2);
        iVar1 = detectPresence(gPython2Name);
        uVar2 = uVar2 - 1;
      } while (iVar1 == 0);
    }
    python2Present::lPython2Present = 1;
LAB_00157a6d:
    if ((tinyfd_verbose != 0) &&
       (printf("lPython2Present %d\n",(ulong)(uint)python2Present::lPython2Present),
       tinyfd_verbose != 0)) {
      printf("gPython2Name %s\n",gPython2Name);
    }
  }
  return python2Present::lPython2Present;
}

Assistant:

static int python2Present(void)
{
	static int lPython2Present = -1 ;
	int i;

	if ( lPython2Present < 0 )
	{
		lPython2Present = 0 ;
		strcpy(gPython2Name , "python2" ) ;
		if ( detectPresence(gPython2Name) ) lPython2Present = 1;
		else
		{
			for ( i = 9 ; i >= 0 ; i -- )
			{
				sprintf( gPython2Name , "python2.%d" , i ) ;
				if ( detectPresence(gPython2Name) )
				{
					lPython2Present = 1;
					break;
				}
			}
		}
		if (tinyfd_verbose) printf("lPython2Present %d\n", lPython2Present) ;
		if (tinyfd_verbose) printf("gPython2Name %s\n", gPython2Name) ;
	}
	return lPython2Present ;
}